

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cpp
# Opt level: O0

vec2 __thiscall CFlow::Get(CFlow *this,vec2 Pos)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM0_Db;
  int y;
  int x;
  vec2 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) == 0) {
    vector2_base<float>::vector2_base(&local_10,0.0,0.0);
  }
  else {
    iVar2 = (int)(in_XMM0_Da / (float)*(int *)(in_RDI + 0x20));
    iVar1 = (int)(in_XMM0_Db / (float)*(int *)(in_RDI + 0x20));
    if ((((iVar2 < 0) || (iVar1 < 0)) || (*(int *)(in_RDI + 0x1c) <= iVar2)) ||
       (*(int *)(in_RDI + 0x18) <= iVar1)) {
      vector2_base<float>::vector2_base(&local_10,0.0,0.0);
    }
    else {
      local_10 = *(vec2 *)(*(long *)(in_RDI + 0x10) +
                          (long)(iVar1 * *(int *)(in_RDI + 0x1c) + iVar2) * 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

vec2 CFlow::Get(vec2 Pos)
{
	if(!m_pCells)
		return vec2(0,0);

	int x = (int)(Pos.x / m_Spacing);
	int y = (int)(Pos.y / m_Spacing);
	if(x < 0 || y < 0 || x >= m_Width || y >= m_Height)
		return vec2(0,0);

	return m_pCells[y*m_Width+x].m_Vel;
}